

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_moving_multiscale
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *displaced,REF_DBL *scalar,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
          REF_DBL complexity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  REF_GLOB *pRVar3;
  REF_NODE pRVar4;
  double dVar5;
  uint uVar6;
  REF_DBL *hessian;
  void *__ptr;
  REF_DBL *pRVar7;
  REF_DBL *pRVar8;
  long lVar9;
  long *plVar10;
  void *__ptr_00;
  REF_NODE pRVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  undefined8 uVar14;
  REF_STATUS RVar15;
  REF_DBL *pRVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  undefined4 uVar23;
  REF_DBL det;
  double local_38;
  
  pRVar11 = ref_grid->node;
  uVar6 = pRVar11->max;
  uVar21 = (ulong)uVar6;
  if ((int)uVar6 < 0) {
    pcVar19 = "malloc hess of REF_DBL negative";
    uVar14 = 0x9c8;
LAB_001c6c8f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar14
           ,"ref_metric_moving_multiscale",pcVar19);
    RVar15 = 1;
  }
  else {
    hessian = (REF_DBL *)malloc(uVar21 * 0x30);
    if (hessian == (REF_DBL *)0x0) {
      pcVar19 = "malloc hess of REF_DBL NULL";
      uVar14 = 0x9c8;
    }
    else {
      __ptr = malloc(uVar21 * 0x48);
      if (__ptr == (void *)0x0) {
        pcVar19 = "malloc jac of REF_DBL NULL";
        uVar14 = 0x9c9;
      }
      else {
        pRVar7 = (REF_DBL *)malloc(uVar21 * 8);
        if (pRVar7 == (REF_DBL *)0x0) {
          pcVar19 = "malloc x of REF_DBL NULL";
          uVar14 = 0x9ca;
        }
        else {
          pRVar8 = (REF_DBL *)malloc((ulong)(uVar6 * 3) << 3);
          if (pRVar8 == (REF_DBL *)0x0) {
            pcVar19 = "malloc grad of REF_DBL NULL";
            uVar14 = 0x9cb;
          }
          else {
            uVar21 = 0;
            lVar22 = 0;
            pRVar16 = displaced;
            do {
              lVar9 = (long)ref_grid->node->max;
              if (0 < lVar9) {
                pRVar3 = ref_grid->node->global;
                lVar17 = 0;
                pRVar12 = pRVar16;
                do {
                  if (-1 < pRVar3[lVar17]) {
                    pRVar7[lVar17] = *pRVar12;
                  }
                  lVar17 = lVar17 + 1;
                  pRVar12 = pRVar12 + 3;
                } while (lVar9 != lVar17);
              }
              uVar6 = ref_recon_gradient(ref_grid,pRVar7,pRVar8,reconstruction);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9d1,"ref_metric_moving_multiscale",(ulong)uVar6,"recon x");
                return uVar6;
              }
              if (ref_grid->twod != 0) {
                lVar9 = (long)ref_grid->node->max;
                if (0 < lVar9) {
                  pRVar3 = ref_grid->node->global;
                  lVar17 = 0;
                  pRVar12 = pRVar8 + 2;
                  do {
                    if (-1 < pRVar3[lVar17]) {
                      *pRVar12 = 1.0;
                    }
                    lVar17 = lVar17 + 1;
                    pRVar12 = pRVar12 + 3;
                  } while (lVar9 != lVar17);
                }
              }
              lVar9 = (long)ref_grid->node->max;
              if (0 < lVar9) {
                plVar10 = ref_grid->node->global;
                uVar18 = 0;
                uVar13 = uVar21;
                do {
                  if (-1 < *plVar10) {
                    *(undefined8 *)((long)__ptr + (uVar13 & 0x7fffffff8) + 0x10) =
                         *(undefined8 *)((long)pRVar8 + (uVar18 & 0x7fffffff8) + 0x10);
                    puVar2 = (undefined8 *)((long)pRVar8 + (uVar18 & 0x7fffffff8));
                    uVar14 = puVar2[1];
                    puVar1 = (undefined8 *)((long)__ptr + (uVar13 & 0x7fffffff8));
                    *puVar1 = *puVar2;
                    puVar1[1] = uVar14;
                  }
                  uVar18 = uVar18 + 0x18;
                  uVar13 = uVar13 + 0x48;
                  plVar10 = plVar10 + 1;
                } while (lVar9 * 0x18 != uVar18);
              }
              lVar22 = lVar22 + 1;
              pRVar16 = pRVar16 + 1;
              uVar21 = uVar21 + 0x18;
            } while (lVar22 != 3);
            free(pRVar8);
            free(pRVar7);
            pRVar4 = ref_grid->node;
            uVar6 = pRVar4->max;
            uVar21 = (ulong)uVar6;
            if ((int)uVar6 < 0) {
              pcVar19 = "malloc xyz of REF_DBL negative";
              uVar14 = 0x9e0;
              goto LAB_001c6c8f;
            }
            __ptr_00 = malloc(uVar21 * 0x18);
            if (__ptr_00 != (void *)0x0) {
              if (uVar21 != 0) {
                pRVar3 = pRVar4->global;
                lVar22 = 0;
                uVar13 = 0;
                pvVar20 = __ptr_00;
                do {
                  if (-1 < pRVar3[uVar13]) {
                    pRVar7 = pRVar11->real;
                    lVar9 = 0;
                    do {
                      *(undefined8 *)((long)pvVar20 + lVar9 * 8) =
                           *(undefined8 *)((long)pRVar7 + lVar9 * 8 + lVar22);
                      *(REF_DBL *)((long)pRVar7 + lVar9 * 8 + lVar22) = displaced[lVar9];
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                  }
                  uVar13 = uVar13 + 1;
                  lVar22 = lVar22 + 0x78;
                  displaced = displaced + 3;
                  pvVar20 = (void *)((long)pvVar20 + 0x18);
                } while (uVar13 != uVar21);
              }
              uVar6 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9e7,"ref_metric_moving_multiscale",(ulong)uVar6,"recon");
                return uVar6;
              }
              lVar22 = (long)ref_grid->node->max;
              if (0 < lVar22) {
                pRVar3 = ref_grid->node->global;
                lVar9 = 0;
                do {
                  if (-1 < pRVar3[lVar9]) {
                    uVar21 = lVar9 * 0x18 & 0x7fffffff8;
                    uVar13 = lVar9 * 0x78 & 0x7fffffff8;
                    pRVar7 = pRVar11->real;
                    *(undefined8 *)((long)pRVar7 + uVar13 + 0x10) =
                         *(undefined8 *)((long)__ptr_00 + uVar21 + 0x10);
                    puVar2 = (undefined8 *)((long)__ptr_00 + uVar21);
                    uVar14 = puVar2[1];
                    puVar1 = (undefined8 *)((long)pRVar7 + uVar13);
                    *puVar1 = *puVar2;
                    puVar1[1] = uVar14;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != lVar22);
              }
              free(__ptr_00);
              uVar6 = ref_recon_roundoff_limit(hessian,ref_grid);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9f0,"ref_metric_moving_multiscale",(ulong)uVar6,
                       "floor metric eigenvalues based on grid size and solution jitter");
                return uVar6;
              }
              pRVar11 = ref_grid->node;
              if (0 < pRVar11->max) {
                lVar22 = 0;
                pRVar7 = metric;
                do {
                  if (-1 < pRVar11->global[lVar22]) {
                    pRVar8 = (REF_DBL *)((long)__ptr + lVar22 * 0x48);
                    uVar6 = ref_matrix_jac_m_jact(pRVar8,hessian + lVar22 * 6,metric + lVar22 * 6);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x9f4,"ref_metric_moving_multiscale",(ulong)uVar6,"J M J^t");
                      return uVar6;
                    }
                    uVar6 = ref_matrix_det_gen(3,pRVar8,&local_38);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x9f6,"ref_metric_moving_multiscale",(ulong)uVar6,"gen det");
                      return uVar6;
                    }
                    lVar9 = 0;
                    do {
                      uVar23 = (undefined4)((ulong)local_38 >> 0x20);
                      if (local_38 <= -local_38) {
                        uVar23 = (undefined4)((ulong)-local_38 >> 0x20);
                      }
                      dVar5 = pow((double)CONCAT44(uVar23,SUB84(local_38,0)),1.0 / (double)p_norm);
                      pRVar7[lVar9] = dVar5 * pRVar7[lVar9];
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 6);
                  }
                  lVar22 = lVar22 + 1;
                  pRVar11 = ref_grid->node;
                  pRVar7 = pRVar7 + 6;
                } while (lVar22 < pRVar11->max);
              }
              free(__ptr);
              free(hessian);
              uVar6 = ref_metric_local_scale(metric,ref_grid,p_norm);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x9fe,"ref_metric_moving_multiscale",(ulong)uVar6,"local scale lp norm");
                return uVar6;
              }
              uVar6 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,complexity);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xa01,"ref_metric_moving_multiscale",(ulong)uVar6,"gradation at complexity")
                ;
                return uVar6;
              }
              return 0;
            }
            pcVar19 = "malloc xyz of REF_DBL NULL";
            uVar14 = 0x9e0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar14
           ,"ref_metric_moving_multiscale",pcVar19);
    RVar15 = 2;
  }
  return RVar15;
}

Assistant:

REF_FCN REF_STATUS ref_metric_moving_multiscale(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *displaced, REF_DBL *scalar,
    REF_RECON_RECONSTRUCTION reconstruction, REF_INT p_norm, REF_DBL gradation,
    REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *jac, *x, *grad, *hess, *xyz, det;
  REF_INT i, j, node;
  ref_malloc(hess, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(x, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (j = 0; j < 3; j++) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      x[node] = displaced[j + 3 * node];
    }
    RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        grad[2 + 3 * node] = 1.0;
      }
    }
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      for (i = 0; i < 3; i++) {
        jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
      }
    }
  }
  ref_free(grad);
  ref_free(x);

  ref_malloc(xyz, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
      ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
    }
  }
  RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "recon");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
    }
  }
  ref_free(xyz);

  RSS(ref_recon_roundoff_limit(hess, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                              &(metric[6 * node])),
        "J M J^t");

    RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p_norm);
    }
  }
  ref_free(jac);
  ref_free(hess);

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}